

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_limit_req_module.c
# Opt level: O2

void ngx_http_limit_req_expire(ngx_http_limit_req_ctx_t *ctx,ngx_uint_t n)

{
  ngx_http_limit_req_shctx_t *tree;
  ngx_queue_t *pnVar1;
  ngx_queue_t *pnVar2;
  ngx_msec_t nVar3;
  ulong uVar4;
  ngx_queue_t *pnVar5;
  ulong uVar6;
  
  nVar3 = ngx_current_msec;
  while( true ) {
    if (2 < n) {
      return;
    }
    tree = ctx->sh;
    pnVar1 = (tree->queue).prev;
    if (&tree->queue == pnVar1) break;
    if (pnVar1[2].prev != (ngx_queue_t *)0x0) {
      return;
    }
    if (n != 0) {
      uVar6 = nVar3 - (long)pnVar1[1].prev;
      uVar4 = -uVar6;
      if (0 < (long)uVar6) {
        uVar4 = uVar6;
      }
      if (uVar4 < 60000) {
        return;
      }
      pnVar5 = (ngx_queue_t *)((uVar4 * ctx->rate) / 1000);
      if (pnVar1[1].next != pnVar5 && -1 < (long)pnVar1[1].next - (long)pnVar5) {
        return;
      }
    }
    pnVar5 = pnVar1->prev;
    pnVar2 = pnVar1->next;
    pnVar2->prev = pnVar5;
    pnVar5->next = pnVar2;
    pnVar1->prev = (ngx_queue_t *)0x0;
    pnVar1->next = (ngx_queue_t *)0x0;
    ngx_rbtree_delete(&tree->rbtree,(ngx_rbtree_node_t *)&pnVar1[-3].next);
    ngx_slab_free_locked(ctx->shpool,&pnVar1[-3].next);
    n = n + 1;
  }
  return;
}

Assistant:

static void
ngx_http_limit_req_expire(ngx_http_limit_req_ctx_t *ctx, ngx_uint_t n)
{
    ngx_int_t                   excess;
    ngx_msec_t                  now;
    ngx_queue_t                *q;
    ngx_msec_int_t              ms;
    ngx_rbtree_node_t          *node;
    ngx_http_limit_req_node_t  *lr;

    now = ngx_current_msec;

    /*
     * n == 1 deletes one or two zero rate entries
     * n == 0 deletes oldest entry by force
     *        and one or two zero rate entries
     */

    while (n < 3) {

        if (ngx_queue_empty(&ctx->sh->queue)) {
            return;
        }

        q = ngx_queue_last(&ctx->sh->queue);

        lr = ngx_queue_data(q, ngx_http_limit_req_node_t, queue);

        if (lr->count) {

            /*
             * There is not much sense in looking further,
             * because we bump nodes on the lookup stage.
             */

            return;
        }

        if (n++ != 0) {

            ms = (ngx_msec_int_t) (now - lr->last);
            ms = ngx_abs(ms);

            if (ms < 60000) {
                return;
            }

            excess = lr->excess - ctx->rate * ms / 1000;

            if (excess > 0) {
                return;
            }
        }

        ngx_queue_remove(q);

        node = (ngx_rbtree_node_t *)
                   ((u_char *) lr - offsetof(ngx_rbtree_node_t, color));

        ngx_rbtree_delete(&ctx->sh->rbtree, node);

        ngx_slab_free_locked(ctx->shpool, node);
    }
}